

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_pageview.cpp
# Opt level: O1

void QtMWidgets::PageView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  undefined8 *puVar5;
  int *piVar6;
  undefined4 local_1c;
  void *local_18;
  undefined4 *local_10;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_1c = *_a[1];
      iVar4 = 0;
      break;
    case 1:
      local_1c = *_a[1];
      iVar4 = 1;
      break;
    case 2:
      piVar6 = (int *)_a[1];
LAB_0014e4f5:
      setCurrentIndex((PageView *)_o,*piVar6);
      return;
    case 3:
      setCurrentWidget((PageView *)_o,*_a[1]);
      return;
    case 4:
      _q_currentIndexChanged((PageView *)_o,*_a[1],*_a[2]);
      return;
    case 5:
      _q_normalizePageAnimation((PageView *)_o,(QVariant *)_a[1]);
      return;
    case 6:
      _q_normalizeAnimationFinished((PageView *)_o);
      return;
    default:
      goto switchD_0014e3c2_caseD_3;
    }
    local_10 = &local_1c;
    local_18 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar4,&local_18);
    break;
  case ReadProperty:
    piVar6 = (int *)*_a;
    if (_id == 2) {
      bVar3 = showPageControl((PageView *)_o);
      *(bool *)piVar6 = bVar3;
    }
    else {
      if (_id == 1) {
        iVar4 = count((PageView *)_o);
      }
      else {
        if (_id != 0) {
          return;
        }
        iVar4 = currentIndex((PageView *)_o);
      }
      *piVar6 = iVar4;
    }
    break;
  case WriteProperty:
    piVar6 = (int *)*_a;
    if (_id == 2) {
      setShowPageControl((PageView *)_o,SUB41(*piVar6,0));
      return;
    }
    if (_id == 0) goto LAB_0014e4f5;
    break;
  case IndexOfMethod:
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == currentChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == widgetRemoved && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    break;
  case RegisterMethodArgumentMetaType:
    if (_id == 3) {
      puVar5 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
        return;
      }
    }
    else {
      puVar5 = (undefined8 *)*_a;
    }
    *puVar5 = 0;
  }
switchD_0014e3c2_caseD_3:
  return;
}

Assistant:

void QtMWidgets::PageView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<PageView *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->widgetRemoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->setCurrentWidget((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 4: _t->_q_currentIndexChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 5: _t->_q_normalizePageAnimation((*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[1]))); break;
        case 6: _t->_q_normalizeAnimationFinished(); break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 3:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (PageView::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PageView::currentChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (PageView::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PageView::widgetRemoved)) {
                *result = 1;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<PageView *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< int*>(_v) = _t->currentIndex(); break;
        case 1: *reinterpret_cast< int*>(_v) = _t->count(); break;
        case 2: *reinterpret_cast< bool*>(_v) = _t->showPageControl(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<PageView *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setCurrentIndex(*reinterpret_cast< int*>(_v)); break;
        case 2: _t->setShowPageControl(*reinterpret_cast< bool*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}